

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

void ImGuizmo::Manipulate
               (float *view,float *projection,OPERATION operation,MODE mode,float *matrix,
               float *deltaMatrix,float *snap,float *localBounds,float *boundsSnap)

{
  int local_54;
  int type;
  vec_t vStack_50;
  undefined1 local_40 [8];
  vec_t camSpacePosition;
  float *deltaMatrix_local;
  float *matrix_local;
  MODE mode_local;
  OPERATION operation_local;
  float *projection_local;
  float *view_local;
  
  camSpacePosition._8_8_ = deltaMatrix;
  ComputeContext(view,projection,matrix,mode);
  if (camSpacePosition._8_8_ != 0) {
    matrix_t::SetToIdentity((matrix_t *)camSpacePosition._8_8_);
  }
  vStack_50 = makeVect(0.0,0.0,0.0,0.0);
  vec_t::TransformPoint((vec_t *)local_40,&stack0xffffffffffffffb0,(matrix_t *)&DAT_00296f6c);
  if (0.001 <= camSpacePosition.x) {
    local_54 = 0;
    if (((DAT_00297089 & 1) != 0) && ((DAT_00297158 & 1) == 0)) {
      if (operation == TRANSLATE) {
        HandleTranslation(matrix,(float *)camSpacePosition._8_8_,&local_54,snap);
      }
      else if (operation == ROTATE) {
        HandleRotation(matrix,(float *)camSpacePosition._8_8_,&local_54,snap);
      }
      else if (operation == SCALE) {
        HandleScale(matrix,(float *)camSpacePosition._8_8_,&local_54,snap);
      }
    }
    if ((localBounds != (float *)0x0) && ((DAT_00297088 & 1) == 0)) {
      HandleAndDrawLocalBounds(localBounds,(matrix_t *)matrix,boundsSnap);
    }
    if ((DAT_00297158 & 1) == 0) {
      if (operation == TRANSLATE) {
        DrawTranslationGizmo(local_54);
      }
      else if (operation == ROTATE) {
        DrawRotationGizmo(local_54);
      }
      else if (operation == SCALE) {
        DrawScaleGizmo(local_54);
      }
    }
  }
  return;
}

Assistant:

void Manipulate(const float *view, const float *projection, OPERATION operation, MODE mode, float *matrix, float *deltaMatrix, float *snap, float *localBounds, float *boundsSnap)
   {
      ComputeContext(view, projection, matrix, mode);

      // set delta to identity 
      if (deltaMatrix)
         ((matrix_t*)deltaMatrix)->SetToIdentity();

      // behind camera
      vec_t camSpacePosition;
      camSpacePosition.TransformPoint(makeVect(0.f, 0.f, 0.f), gContext.mMVP);
      if (camSpacePosition.z < 0.001f)
         return;

      // -- 
      int type = NONE;
      if (gContext.mbEnable)
      {
		  if (!gContext.mbUsingBounds)
		  {
			  switch (operation)
			  {
			  case ROTATE:
				  HandleRotation(matrix, deltaMatrix, type, snap);
				  break;
			  case TRANSLATE:
				  HandleTranslation(matrix, deltaMatrix, type, snap);
				  break;
			  case SCALE:
				  HandleScale(matrix, deltaMatrix, type, snap);
				  break;
			  }
		  }
      }

	  if (localBounds && !gContext.mbUsing)
		  HandleAndDrawLocalBounds(localBounds, (matrix_t*)matrix, boundsSnap);

	  if (!gContext.mbUsingBounds)
	  {
		  switch (operation)
		  {
		  case ROTATE:
			  DrawRotationGizmo(type);
			  break;
		  case TRANSLATE:
			  DrawTranslationGizmo(type);
			  break;
		  case SCALE:
			  DrawScaleGizmo(type);
			  break;
		  }
	  }
   }